

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>::
enum_parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
          (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *this,
          cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
          *m)

{
  named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>
  *pnVar1;
  iterator pvVar2;
  iterator pvVar3;
  ref_type pbVar4;
  ref_type pbVar5;
  res_type pbVar6;
  ref_type piVar7;
  res_type poVar8;
  iterator __x;
  uint *local_118;
  char *local_110;
  uint local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  uint *local_f8;
  char *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *local_b8;
  string *local_b0;
  cstring local_a8;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_90;
  cstring local_70;
  cstring local_60;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> local_31;
  
  pvVar2 = name->m_begin;
  pvVar3 = name->m_end;
  *(undefined ***)this = &PTR__basic_param_001cbf68;
  local_b0 = (string *)(this + 8);
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 8) =
       this + 0x18;
  std::__cxx11::string::_M_construct<char_const*>(local_b0,pvVar2,pvVar3);
  local_f0 = (char *)0x0;
  local_e8 = local_e8 & 0xffffff00;
  local_f8 = &local_e8;
  pbVar4 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[]((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
                         *)m);
  std::__cxx11::string::_M_replace((ulong)&local_f8,0,local_f0,(ulong)pbVar4->m_begin);
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x28)
       = this + 0x38;
  if (local_f8 == &local_e8) {
    *(uint *)(this + 0x38) = local_e8;
    *(undefined4 *)(this + 0x3c) = uStack_e4;
    *(undefined4 *)(this + 0x40) = uStack_e0;
    *(undefined4 *)(this + 0x44) = uStack_dc;
  }
  else {
    *(uint **)(this + 0x28) = local_f8;
    *(ulong *)(this + 0x38) = CONCAT44(uStack_e4,local_e8);
  }
  *(char **)(this + 0x30) = local_f0;
  local_f0 = (char *)0x0;
  local_e8 = local_e8 & 0xffffff00;
  local_110 = (char *)0x0;
  local_108 = local_108 & 0xffffff00;
  local_118 = &local_108;
  local_f8 = &local_e8;
  pbVar5 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[](&m->m_param);
  std::__cxx11::string::_M_replace((ulong)&local_118,0,local_110,(ulong)pbVar5->m_begin);
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x48)
       = this + 0x58;
  if (local_118 == &local_108) {
    *(uint *)(this + 0x58) = local_108;
    *(undefined4 *)(this + 0x5c) = uStack_104;
    *(undefined4 *)(this + 0x60) = uStack_100;
    *(undefined4 *)(this + 100) = uStack_fc;
  }
  else {
    *(uint **)(this + 0x48) = local_118;
    *(ulong *)(this + 0x58) = CONCAT44(uStack_104,local_108);
  }
  *(char **)(this + 0x50) = local_110;
  local_110 = (char *)0x0;
  local_108 = local_108 & 0xffffff00;
  local_d0 = (char *)0x0;
  local_c8 = 0;
  local_118 = &local_108;
  local_d8 = &local_c8;
  pbVar6 = nfp::
           named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
           ::operator[]((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
                         *)m);
  std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,(ulong)pbVar6->m_begin);
  local_b8 = this + 0x78;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x68)
       = local_b8;
  if (local_d8 == &local_c8) {
    *(ulong *)local_b8 = CONCAT71(uStack_c7,local_c8);
    *(undefined8 *)(this + 0x80) = uStack_c0;
  }
  else {
    *(undefined1 **)(this + 0x68) = local_d8;
    *(ulong *)(this + 0x78) = CONCAT71(uStack_c7,local_c8);
  }
  *(char **)(this + 0x70) = local_d0;
  local_d0 = (char *)0x0;
  local_c8 = 0;
  local_50 = &local_40;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x88)
       = this + 0x98;
  this[0x98] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)0x0;
  *(undefined8 *)(this + 0x99) = local_3f;
  *(undefined4 *)(this + 0xa1) = local_37;
  *(undefined2 *)(this + 0xa5) = local_33;
  this[0xa7] = local_31;
  *(undefined8 *)(this + 0x90) = 0;
  local_48 = 0;
  local_40 = 0;
  *(undefined2 *)(this + 0xa8) = 1;
  this[0xaa] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)0x0;
  this[0xab] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)
               ((m->
                super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                ).
                super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                .m_param.m_erased ^ 1);
  local_90.super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)(this + 0xb0) = 0;
  local_d8 = &local_c8;
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::move_assign
            ((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)(this + 0xb0),
             &local_90);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_90);
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  local_a8.m_begin = help_prefix;
  local_a8.m_end = DAT_001cfc28;
  local_70.m_begin = ":";
  local_70.m_end = "";
  local_60.m_begin = pvVar2;
  local_60.m_end = pvVar3;
  basic_param::add_cla_id_impl((basic_param *)this,&local_a8,&local_60,&local_70,false,true);
  *(undefined ***)this = &PTR__parameter_001cc5b0;
  pnVar1 = &(m->
            super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
            ).m_param;
  piVar7 = nfp::
           named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>
           ::operator[](pnVar1);
  std::
  map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
  ::map((map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
         *)(this + 0xe8),*piVar7,(less<boost::unit_test::basic_cstring<const_char>_> *)&local_f8,
        (allocator_type *)&local_118);
  *(undefined4 *)(this + 0x118) = 0;
  poVar8 = nfp::
           named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
           ::operator[]((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                         *)m);
  *(output_format *)(this + 0x11c) = *poVar8;
  *(undefined ***)this = &PTR__enum_parameter_001cc528;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  piVar7 = nfp::
           named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>
           ::operator[](pnVar1);
  if (piVar7->_M_len != 0) {
    __x = piVar7->_M_array;
    do {
      std::
      vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
      ::push_back((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                   *)(this + 0x120),&__x->first);
      __x = __x + 1;
    } while (__x != piVar7->_M_array + piVar7->_M_len);
  }
  return;
}

Assistant:

enum_parameter( cstring name, Modifiers const& m )
#endif
    : base( name, m )
    {
#ifdef BOOST_TEST_CLA_NEW_API
        auto const& values = m[enum_values<EnumType>::value];
        auto it = values.begin();
#else
        std::vector<std::pair<cstring, EnumType> > const& values = m[enum_values<EnumType>::value];
        typename std::vector<std::pair<cstring, EnumType> >::const_iterator it = values.begin();
#endif
        while( it != values.end() ) {
            m_valid_names.push_back( it->first );
            ++it;
        }
    }